

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int c2w(int c_count,char *c,int w_count,wchar_t *w)

{
  uint uVar1;
  uint uVar2;
  uint error_status;
  char *p1;
  
  if (w != (wchar_t *)0x0) {
    *w = L'\0';
  }
  uVar2 = 0;
  if ((0 < w_count && w != (wchar_t *)0x0) && (*c != '\0')) {
    *w = L'\0';
    error_status = 0;
    p1 = (char *)0x0;
    uVar2 = ON_ConvertUTF8ToWideChar(0,c,c_count,w,w_count,&error_status,0xffffffff,0xfffd,&p1);
    uVar1 = w_count;
    if ((int)uVar2 <= w_count && (int)uVar2 >= 1) {
      uVar1 = uVar2;
    }
    if (w_count < (int)uVar2 || (int)uVar2 < 1) {
      uVar2 = 0;
    }
    w[uVar1] = L'\0';
    if (error_status != 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
                 ,0x78,"",
                 "Error converting UTF-8 encoded char string to UTF-16 encoded wchar_t string.");
    }
  }
  return uVar2;
}

Assistant:

static int c2w( int c_count,
                const char* c,
                int w_count,
                wchar_t* w // array of at least w_count+1 wide characters
                )
{
  // convert UTF-8 string to UTF-16 string
  int rc = 0;
  if ( w )
    w[0] = 0;
  // returns length of converted c[]
  if ( w_count > 0 && w && c_count > 0 && c && c[0] ) {
    w[0] = 0;
    if ( c )
    {
      unsigned int error_status = 0;
      unsigned int error_mask = 0xFFFFFFFF;
      ON__UINT32 error_code_point = 0xFFFD;
      const char* p1 = 0;
      rc = ON_ConvertUTF8ToWideChar(false,c,c_count,w,w_count,&error_status,error_mask,error_code_point,&p1);
      if ( rc > 0 && rc <= w_count )
        w[rc] = 0;
      else {
        w[w_count] = 0;
        rc = 0;
      }
      if ( 0 != error_status )
      {
        ON_ERROR("Error converting UTF-8 encoded char string to UTF-16 encoded wchar_t string.");
      }
    }
  }
	return rc;
}